

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_measures.cc
# Opt level: O2

S2Point * S2::GetCentroid(S2Point *__return_storage_ptr__,S2ShapeIndex *index)

{
  int iVar1;
  int iVar2;
  S2Shape *shape;
  int i;
  uint uVar3;
  S2Point SStack_48;
  undefined4 extraout_var;
  
  iVar1 = GetDimension(index);
  __return_storage_ptr__->c_[2] = 0.0;
  __return_storage_ptr__->c_[0] = 0.0;
  __return_storage_ptr__->c_[1] = 0.0;
  uVar3 = 0;
  while( true ) {
    iVar2 = (*index->_vptr_S2ShapeIndex[2])(index);
    if (iVar2 <= (int)uVar3) break;
    iVar2 = (*index->_vptr_S2ShapeIndex[3])(index,(ulong)uVar3);
    shape = (S2Shape *)CONCAT44(extraout_var,iVar2);
    if (shape != (S2Shape *)0x0) {
      iVar2 = (*shape->_vptr_S2Shape[4])(shape);
      if (iVar2 == iVar1) {
        GetCentroid(&SStack_48,shape);
        util::math::internal_vector::BasicVector<Vector3,double,3ul>::PlusEq<0ul,1ul,2ul>
                  (__return_storage_ptr__,&SStack_48);
      }
    }
    uVar3 = uVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point GetCentroid(const S2ShapeIndex& index) {
  int dim = GetDimension(index);
  S2Point centroid;
  for (int i = 0; i < index.num_shape_ids(); ++i) {
    S2Shape* shape = index.shape(i);
    if (shape && shape->dimension() == dim) {
      centroid += S2::GetCentroid(*shape);
    }
  }
  return centroid;
}